

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# close.c
# Opt level: O2

void lws_remove_child_from_any_parent(lws *wsi)

{
  lws *plVar1;
  lws_protocols *plVar2;
  lws **pplVar3;
  lws **pplVar4;
  
  if (wsi->parent != (lws *)0x0) {
    pplVar3 = &wsi->parent->child_list;
    do {
      pplVar4 = pplVar3;
      plVar1 = *pplVar4;
      if (plVar1 == (lws *)0x0) {
        _lws_log(1,"%s: failed to detach from parent\n","lws_remove_child_from_any_parent");
        goto LAB_00110e7a;
      }
      pplVar3 = &plVar1->sibling_list;
    } while (plVar1 != wsi);
    _lws_log(8,"%s: detach %p from parent %p\n","lws_remove_child_from_any_parent",wsi);
    plVar2 = wsi->parent->protocol;
    if (plVar2 != (lws_protocols *)0x0) {
      (*plVar2->callback)(wsi,LWS_CALLBACK_CHILD_CLOSING,wsi->parent->user_space,wsi,0);
    }
    *pplVar4 = wsi->sibling_list;
LAB_00110e7a:
    wsi->parent = (lws *)0x0;
  }
  return;
}

Assistant:

void
lws_remove_child_from_any_parent(struct lws *wsi)
{
	struct lws **pwsi;
	int seen = 0;

	if (!wsi->parent)
		return;

	/* detach ourselves from parent's child list */
	pwsi = &wsi->parent->child_list;
	while (*pwsi) {
		if (*pwsi == wsi) {
			lwsl_info("%s: detach %p from parent %p\n", __func__,
				  wsi, wsi->parent);

			if (wsi->parent->protocol)
				wsi->parent->protocol->callback(wsi,
						LWS_CALLBACK_CHILD_CLOSING,
					       wsi->parent->user_space, wsi, 0);

			*pwsi = wsi->sibling_list;
			seen = 1;
			break;
		}
		pwsi = &(*pwsi)->sibling_list;
	}
	if (!seen)
		lwsl_err("%s: failed to detach from parent\n", __func__);

	wsi->parent = NULL;
}